

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O3

bool __thiscall QMakeProject::test(QMakeProject *this,ProKey *func,QList<ProStringList> *args)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  Span *pSVar4;
  char16_t *pcVar5;
  VisitReturn VVar6;
  CutResult CVar7;
  QChar QVar8;
  ulong uVar9;
  int iVar10;
  long in_FS_OFFSET;
  bool bVar11;
  QAnyStringView QVar12;
  const_iterator cVar13;
  const_iterator cVar14;
  QArrayData *local_70;
  char16_t *local_68;
  undefined8 local_60;
  QArrayDataPointer<ProString> local_58;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QMakeEvaluator).m_current.pro = (ProFile *)0x0;
  (this->super_QMakeEvaluator).m_current.line = 0;
  cVar13 = QHash<ProKey,_QMakeInternal::QMakeBuiltin>::constFindImpl<ProKey>
                     ((QHash<ProKey,_QMakeInternal::QMakeBuiltin> *)(QMakeInternal::statics + 0x248)
                      ,func);
  if (cVar13.i.d == (Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *)0x0 &&
      cVar13.i.bucket == 0) {
    cVar14 = QHash<ProKey,_ProFunctionDef>::constFindImpl<ProKey>
                       (&(this->super_QMakeEvaluator).m_functionDefs.testFunctions,func);
    if (cVar14.i.d == (Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *)0x0 &&
        cVar14.i.bucket == 0) {
      local_70 = (QArrayData *)0x0;
      local_68 = L"\'%1\' is not a recognized test function.";
      local_60 = 0x27;
      pcVar5 = (func->super_ProString).m_string.d.ptr;
      local_58.d = (Data *)(long)(func->super_ProString).m_offset;
      local_40 = (long)(func->super_ProString).m_length;
      CVar7 = QtPrivate::QContainerImplHelper::mid
                        ((func->super_ProString).m_string.d.size,(qsizetype *)&local_58,&local_40);
      QVar8.ucs = (char16_t)local_40;
      iVar10 = (int)pcVar5 + (int)local_58.d * 2;
      if (CVar7 == Null) {
        iVar10 = 0;
        QVar8.ucs = L'\0';
      }
      QVar12.m_size = (size_t)&local_70;
      QVar12.field_0.m_data = &local_58;
      QString::arg_impl(QVar12,iVar10,QVar8);
      QMakeEvaluator::message(&this->super_QMakeEvaluator,0x310,(QString *)&local_58);
      if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_70 != (QArrayData *)0x0) {
        LOCK();
        (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_70,2,0x10);
        }
      }
      bVar11 = false;
    }
    else {
      pSVar4 = (cVar14.i.d)->spans;
      uVar9 = cVar14.i.bucket >> 7;
      VVar6 = QMakeEvaluator::evaluateBoolFunction
                        (&this->super_QMakeEvaluator,
                         (ProFunctionDef *)
                         (pSVar4[uVar9].entries[pSVar4[uVar9].offsets[(uint)cVar14.i.bucket & 0x7f]]
                          .storage.data + 0x30),args,&func->super_ProString);
      if (VVar6 == ReturnError) goto LAB_002a195d;
      bVar11 = VVar6 != ReturnFalse;
    }
  }
  else {
    pSVar2 = (cVar13.i.d)->spans;
    uVar9 = cVar13.i.bucket >> 7;
    pEVar3 = pSVar2[uVar9].entries;
    bVar1 = pSVar2[uVar9].offsets[(uint)cVar13.i.bucket & 0x7f];
    prepareBuiltinArgs((ProStringList *)&local_58,args);
    VVar6 = QMakeEvaluator::evaluateBuiltinConditional
                      (&this->super_QMakeEvaluator,
                       (QMakeBuiltin *)(pEVar3[bVar1].storage.data + 0x30),func,
                       (ProStringList *)&local_58);
    if (VVar6 == ReturnError) {
LAB_002a195d:
      qmakeClearCaches();
      exit(3);
    }
    bVar11 = VVar6 != ReturnFalse;
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar11;
}

Assistant:

bool QMakeProject::test(const ProKey &func, const QList<ProStringList> &args)
{
    m_current.clear();

    auto adef = statics.functions.constFind(func);
    if (adef != statics.functions.constEnd())
        return boolRet(evaluateBuiltinConditional(*adef, func, prepareBuiltinArgs(args)));

    QHash<ProKey, ProFunctionDef>::ConstIterator it =
            m_functionDefs.testFunctions.constFind(func);
    if (it != m_functionDefs.testFunctions.constEnd())
        return boolRet(evaluateBoolFunction(*it, args, func));

    evalError(QStringLiteral("'%1' is not a recognized test function.")
              .arg(func.toQStringView()));
    return false;
}